

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

locale __thiscall
booster::locale::impl_std::create_basic_formatting<char>
          (impl_std *this,locale *in,string *locale_name)

{
  time_put_from_base<char> *this_00;
  locale base;
  locale local_18;
  
  create_basic_parsing<char>(this,in,locale_name);
  std::locale::locale(&base,(locale_name->_M_dataplus)._M_p);
  this_00 = (time_put_from_base<char> *)operator_new(0x18);
  time_put_from_base<char>::time_put_from_base(this_00,&base,0);
  std::locale::locale<booster::locale::impl_std::time_put_from_base<char>>
            (&local_18,(locale *)this,this_00);
  std::locale::operator=((locale *)this,&local_18);
  std::locale::~locale(&local_18);
  std::locale::~locale(&base);
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_basic_formatting(std::locale const &in,std::string const &locale_name)
{
    std::locale tmp = create_basic_parsing<CharType>(in,locale_name);
    std::locale base(locale_name.c_str());
    tmp = std::locale(tmp,new time_put_from_base<CharType>(base));
    return tmp;
}